

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_A_FaceMaster(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *self;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  uint uVar7;
  VMValue *pVVar8;
  AActor *other;
  char *__assertion;
  bool bVar9;
  double z_add;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004f7d0d;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = (AActor *)(param->field_0).field_1.a;
    pVVar8 = param;
    uVar7 = numparam;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar6 = (self->super_DThinker).super_DObject.Class;
      bVar9 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar7 = (uint)bVar9;
      pVVar8 = (VMValue *)(ulong)(pPVar6 == pPVar3 || bVar9);
      if (pPVar6 != pPVar3 && !bVar9) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_004f7d0d;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_004f7ce2;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar5 = (**(code **)*puVar2)(puVar2,pVVar8,uVar7,ret);
          puVar2[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar2[1];
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004f7d0d;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_30.Degrees = 0.0;
      if (3 < numparam) {
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_30.Degrees = (double)param[3].field_0.field_1.a;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xb94,
                        "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      local_38.Degrees = 270.0;
      if (4 < numparam) {
        VVar1 = param[4].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_38.Degrees = (double)param[4].field_0.field_1.a;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xb95,
                        "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      local_48.Degrees = 0.0;
      local_40.Degrees = 0.0;
      if (5 < numparam) {
        VVar1 = param[5].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_40.Degrees = (double)param[5].field_0.field_1.a;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xb96,
                        "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if (6 < numparam) {
        VVar1 = param[6].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_48.Degrees = (double)param[6].field_0.field_1.a;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xb97,
                        "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      iVar4 = 0;
      if (7 < numparam) {
        VVar1 = param[7].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar4 = param[7].field_0.i;
        }
        else {
          iVar4 = 0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                          ,0xb98,
                          "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
        }
      }
      z_add = 0.0;
      if (8 < numparam) {
        VVar1 = param[8].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          z_add = param[8].field_0.f;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xb99,
                        "int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      other = (self->master).field_0.p;
      if ((other != (AActor *)0x0) &&
         (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (self->master).field_0.p = (AActor *)0x0;
        other = (AActor *)0x0;
      }
      A_Face(self,other,&local_30,&local_38,&local_40,&local_48,iVar4,z_add);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_004f7ce2:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004f7d0d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                ,0xb93,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_FaceMaster)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_ANGLE_OPT(max_turn) { max_turn = 0.; }
	PARAM_ANGLE_OPT(max_pitch) { max_pitch = 270.; }
	PARAM_ANGLE_OPT(ang_offset) { ang_offset = 0.; }
	PARAM_ANGLE_OPT(pitch_offset) { pitch_offset = 0.; }
	PARAM_INT_OPT(flags) { flags = 0; }
	PARAM_FLOAT_OPT(z_add) { z_add = 0; }

	A_Face(self, self->master, max_turn, max_pitch, ang_offset, pitch_offset, flags, z_add);
	return 0;
}